

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall
CTcGenTarg::build_local_symbol_records(CTcGenTarg *this,CTcCodeStream *cs,CVmHashTable *tab)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint val;
  uint uVar5;
  ulong uVar6;
  dbglcl *this_00;
  CTcStreamAnchor *anchor;
  ulong uVar7;
  long lVar8;
  void *__buf;
  bool bVar9;
  CTcStreamAnchor *local_b0;
  char nbuf [81];
  
  if (1 < G_sizes.dbg_fmt_vsn) {
    local_b0 = (CTcStreamAnchor *)&(cs->super_CTcDataStream).first_anchor_;
    while (local_b0 = local_b0->nxt_, local_b0 != (CTcStreamAnchor *)0x0) {
      uVar7 = local_b0->ofs_;
      uVar1 = CTcDataStream::readu2_at(&cs->super_CTcDataStream,uVar7 + 8);
      if (uVar1 != 0) {
        uVar7 = uVar7 + (long)G_sizes.dbg_hdr + (ulong)uVar1;
        uVar1 = CTcDataStream::readu2_at(&cs->super_CTcDataStream,uVar7);
        uVar2 = uVar1 * G_sizes.dbg_line;
        uVar1 = CTcDataStream::readu2_at(&cs->super_CTcDataStream,uVar2 + uVar7 + 4);
        lVar8 = (ulong)(uVar1 * 2) + uVar7 + uVar2 + 6;
        for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
          uVar3 = CTcDataStream::readu2_at(&cs->super_CTcDataStream,lVar8 + 2);
          lVar8 = lVar8 + G_sizes.dbg_frame;
          while (bVar9 = uVar3 != 0, uVar3 = uVar3 - 1, bVar9) {
            uVar4 = CTcDataStream::readu2_at(&cs->super_CTcDataStream,lVar8 + 2);
            uVar7 = G_sizes.lcl_hdr + lVar8;
            if ((uVar4 & 4) == 0) {
              uVar4 = CTcDataStream::readu2_at(&cs->super_CTcDataStream,uVar7);
              uVar6 = (ulong)(uVar4 + 2);
            }
            else {
              uVar4 = CTcDataStream::readu4_at(&cs->super_CTcDataStream,uVar7);
              val = CTcDataStream::readu2_at(G_lcl_stream,(ulong)uVar4);
              uVar6 = 4;
              if (val < 0x51) {
                __buf = (void *)(ulong)val;
                CTcDataStream::copy_to_buf(G_lcl_stream,nbuf,(ulong)uVar4 + 2,(ulong)__buf);
                this_00 = (dbglcl *)CVmHashTable::find(tab,nbuf,(size_t)__buf);
                if (this_00 == (dbglcl *)0x0) {
                  anchor = CTcDataStream::add_anchor(G_ds,(CTcSymbol *)0x0,(CTcAbsFixup **)0x0);
                  this_00 = (dbglcl *)operator_new(0x38);
                  dbglcl::dbglcl(this_00,nbuf,(size_t)__buf,anchor,G_ds->ofs_);
                  CVmHashTable::add(tab,(CVmHashEntry *)this_00);
                  CTcDataStream::write2(G_ds,val);
                  CTcDataStream::write(G_ds,(int)nbuf,__buf,(size_t)anchor);
                }
                CTcAbsFixup::add_abs_fixup
                          (this_00->anchor->fixup_list_head_,&cs->super_CTcDataStream,uVar7);
                CTcDataStream::write4_at(&cs->super_CTcDataStream,uVar7,this_00->ofs);
                uVar6 = 4;
              }
            }
            lVar8 = uVar7 + uVar6;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CTcGenTarg::build_local_symbol_records(CTcCodeStream *cs,
                                            CVmHashTable *tab)
{
    CTcStreamAnchor *anchor;

    /* this only applies for debug format 2+ */
    if (G_sizes.dbg_fmt_vsn < 2)
        return;

    /* go through the list of anchors in the code stream */
    for (anchor = cs->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong start_ofs;
        ulong dbg_ofs;
        uint cnt;
        ulong ofs;

        /* get the anchor's stream offset */
        start_ofs = anchor->get_ofs();

        /* read the debug table offset from the method header */
        dbg_ofs = start_ofs + cs->readu2_at(start_ofs + 8);

        /* if there's no debug table for this method, go on to the next */
        if (dbg_ofs == start_ofs)
            continue;

        /* read the number of line entries */
        ofs = dbg_ofs + G_sizes.dbg_hdr;
        cnt = cs->readu2_at(ofs);
        ofs += 2;

        /* skip past the line entries */
        ofs += cnt * G_sizes.dbg_line;

        /* skip the end offset */
        ofs += 2;

        /* read the frame count */
        uint frame_cnt = cs->readu2_at(ofs);
        ofs += 2;

        /* skip the frame index */
        ofs += 2 * frame_cnt;

        /* go through the individual frames */
        for (uint fi = 0 ; fi < frame_cnt ; ++fi)
        {
            /* get the number of entries */
            cnt = cs->readu2_at(ofs + 2);

            /* skip to the first entry */
            ofs += G_sizes.dbg_frame;

            /* parse each entry */
            for (uint i = 0 ; i < cnt ; ++i)
            {
                /* read the flags */
                uint flags = cs->readu2_at(ofs + 2);
                ofs += G_sizes.lcl_hdr;

                /* 
                 *   If this is an out-of-line entry, we currently have a
                 *   pointer to the local variable stream, and we need to
                 *   move it to the constant pool instead.  If it's in-line,
                 *   there's nothing to do - we just skip the record. 
                 */
                if (flags & 0x0004)
                {
                    /* 
                     *   It's a constant pool entry.  Read the name from the
                     *   local variable pool.  
                     */
                    ulong lofs = cs->readu4_at(ofs);
                    size_t nlen = G_lcl_stream->readu2_at(lofs);
                    if (nlen <= TOK_SYM_MAX_LEN)
                    {
                        /* read the name */
                        char nbuf[TOK_SYM_MAX_LEN + 1];
                        G_lcl_stream->copy_to_buf(nbuf, lofs + 2, nlen);

                        /* 
                         *   Look up the name in our symbol table, to see if
                         *   we've already defined it.  If so, re-use the
                         *   same name.  A few local variable names tend to
                         *   be used over and over, so it saves a lot of
                         *   space to share one copy for each instance of a
                         *   reused name. 
                         */
                        dbglcl *l = (dbglcl *)tab->find(nbuf, nlen);
                        if (l == 0)
                        {
                            /* add an anchor for the constant pool entry */
                            CTcStreamAnchor *anchor = G_ds->add_anchor(0, 0);

                            /* 
                             *   It's not already defined.  Add a new symbol
                             *   table entry for it.  The entry will go at
                             *   the current constant pool stream offset.  
                             */
                            l = new dbglcl(nbuf, nlen, anchor,
                                           G_ds->get_ofs());
                            tab->add(l);

                            /* copy the name to the constant pool stream */
                            G_ds->write2(nlen);
                            G_ds->write(nbuf, nlen);
                        }

                        /* add a fixup for this pointer in the code stream */
                        CTcAbsFixup::add_abs_fixup(
                            l->anchor->fixup_list_head_, cs, ofs);

                        /* 
                         *   Overwrite the local stream offset with the
                         *   constant pool offset of the symbol. 
                         */
                        cs->write4_at(ofs, l->ofs);
                    }

                    /* skip the record */
                    ofs += 4;
                }
                else
                {
                    /* it's in-line - just skip to the next record */
                    ofs += cs->readu2_at(ofs) + 2;
                }
            }
        }
    }
}